

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O0

void __thiscall
OpenDataServerCommand::setParameters
          (OpenDataServerCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *params)

{
  reference pvVar1;
  MathInterpreter *pMVar2;
  DataBase *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *data;
  Expression *pEVar3;
  double extraout_XMM0_Qa;
  string local_58;
  Expression *local_38;
  Expression *e;
  MathInterpreter *local_20;
  MathInterpreter *m;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *params_local;
  OpenDataServerCommand *this_local;
  
  m = (MathInterpreter *)params;
  params_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this;
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](params,1);
  std::__cxx11::string::operator=((string *)&this->port_string,(string *)pvVar1);
  pMVar2 = (MathInterpreter *)operator_new(0x20);
  this_00 = DataBase::getInstance();
  data = DataBase::getInVarMap_abi_cxx11_(this_00);
  MathInterpreter::MathInterpreter(pMVar2,data);
  local_20 = pMVar2;
  std::__cxx11::string::string((string *)&local_58,(string *)&this->port_string);
  pEVar3 = MathInterpreter::interpret(pMVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_38 = pEVar3;
  (**pEVar3->_vptr_Expression)();
  this->port = (unsigned_short)(int)extraout_XMM0_Qa;
  if (local_38 != (Expression *)0x0) {
    (*local_38->_vptr_Expression[2])();
  }
  pMVar2 = local_20;
  if (local_20 != (MathInterpreter *)0x0) {
    MathInterpreter::~MathInterpreter(local_20);
    operator_delete(pMVar2,0x20);
  }
  return;
}

Assistant:

void OpenDataServerCommand::setParameters(vector<string> params) {
  this->port_string = params[1];
  MathInterpreter *m = new MathInterpreter(DataBase::getInstance()->getInVarMap());
  Expression* e = m->interpret(this->port_string);
  this->port = e->calculate();
  delete e;
  delete m;
}